

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O3

void strwait(void)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = nva_cards[cnum]->bar0;
  iVar2 = 0x1000001;
  while (((((*(uint *)((long)pvVar1 + 0x400404) >> 0x11 & 1) != 0 ||
           (*(int *)((long)pvVar1 + 0x400400) != 0)) ||
          ((*(uint *)((long)pvVar1 + 0x400700) >> 8 & 1) != 0)) ||
         (*(int *)((long)pvVar1 + 0x800) != 0))) {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      puts("Aiiii, xfer is hung. bailing.");
      exit(1);
    }
  }
  do {
    do {
    } while ((*(uint *)((long)pvVar1 + 0x400404) >> 0x11 & 1) != 0);
  } while (((*(int *)((long)pvVar1 + 0x400400) != 0) ||
           ((*(uint *)((long)pvVar1 + 0x400700) >> 8 & 1) != 0)) ||
          (*(int *)((long)pvVar1 + 0x800) != 0));
  return;
}

Assistant:

void strwait() {
	int ctr = 0;
	while (nva_rd32(cnum, 0x400404) & 0x20000 || nva_rd32(cnum, 0x400400) || nva_rd32(cnum, 0x400700) & 0x100 || nva_rd32(cnum, 0x40082c & 0x800)) {
		ctr++;
		if (ctr > 0x1000000) {
			printf("Aiiii, xfer is hung. bailing.\n");
			exit(1);
		}
	}
	while (nva_rd32(cnum, 0x400404) & 0x20000 || nva_rd32(cnum, 0x400400) || nva_rd32(cnum, 0x400700) & 0x100 || nva_rd32(cnum, 0x40082c & 0x800));
}